

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

Message * __thiscall
FIX::Session::newMessage(Message *__return_storage_ptr__,Session *this,MsgType *msgType)

{
  string *value;
  bool bVar1;
  DataDictionary *pDVar2;
  message_order *headerOrder;
  message_order *trailerOrder;
  message_order *pmVar3;
  Message *message;
  FieldBase local_88;
  
  pDVar2 = DataDictionaryProvider::getSessionDataDictionary
                     (&this->m_dataDictionaryProvider,&(this->m_sessionID).m_beginString);
  if (pDVar2->m_storeMsgFieldsOrder == false) {
    Message::Message(__return_storage_ptr__);
    FieldMap::setField(&(__return_storage_ptr__->m_header).super_FieldMap,(FieldBase *)msgType,true)
    ;
  }
  else {
    headerOrder = DataDictionary::getHeaderOrderedFields(pDVar2);
    trailerOrder = DataDictionary::getTrailerOrderedFields(pDVar2);
    if ((this->m_sessionID).m_isFIXT == true) {
      value = &(msgType->super_StringField).super_FieldBase.m_string;
      MsgType::MsgType((MsgType *)&local_88,value);
      bVar1 = Message::isAdminMsgType((MsgType *)&local_88);
      FieldBase::~FieldBase(&local_88);
      if (!bVar1) {
        ApplVerID::ApplVerID((ApplVerID *)&local_88,&this->m_senderDefaultApplVerID);
        pDVar2 = DataDictionaryProvider::getApplicationDataDictionary
                           (&this->m_dataDictionaryProvider,(ApplVerID *)&local_88);
        FieldBase::~FieldBase(&local_88);
        pmVar3 = DataDictionary::getMessageOrderedFields(pDVar2,value);
        Message::Message(__return_storage_ptr__,headerOrder,trailerOrder,pmVar3);
        FieldMap::setField(&(__return_storage_ptr__->m_header).super_FieldMap,(FieldBase *)msgType,
                           true);
        return __return_storage_ptr__;
      }
    }
    pmVar3 = DataDictionary::getMessageOrderedFields
                       (pDVar2,&(msgType->super_StringField).super_FieldBase.m_string);
    Message::Message(__return_storage_ptr__,headerOrder,trailerOrder,pmVar3);
    FieldMap::setField(&(__return_storage_ptr__->m_header).super_FieldMap,(FieldBase *)msgType,true)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Message Session::newMessage(const MsgType &msgType) const {
  const DataDictionary &sessionDD = m_dataDictionaryProvider.getSessionDataDictionary(m_sessionID.getBeginString());

  if (!sessionDD.isMessageFieldsOrderPreserved()) {
    Message message = Message();
    message.getHeader().setField(msgType);
    return message;
  } else {
    const message_order &headerOrder = sessionDD.getHeaderOrderedFields();
    const message_order &trailerOrder = sessionDD.getTrailerOrderedFields();
    if (!m_sessionID.isFIXT() || Message::isAdminMsgType(msgType.getValue())) {
      const message_order &messageOrder = sessionDD.getMessageOrderedFields(msgType.getValue());
      Message message = Message(headerOrder, trailerOrder, messageOrder);
      message.getHeader().setField(msgType);
      return message;
    } else {
      const DataDictionary &applicationDD
          = m_dataDictionaryProvider.getApplicationDataDictionary(m_senderDefaultApplVerID);
      const message_order &messageOrder = applicationDD.getMessageOrderedFields(msgType.getValue());
      Message message = Message(headerOrder, trailerOrder, messageOrder);
      message.getHeader().setField(msgType);
      return message;
    }
  }
}